

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum.hpp
# Opt level: O2

void magic_enum::
     enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__1,main::__2>&,void>
               (overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:60:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:63:5)>
                *f,Color value)

{
  ostream *poVar1;
  char *pcVar2;
  
  if ((int)f == 0) {
    pcVar2 = "Red";
  }
  else {
    if ((int)f != 1) {
      return;
    }
    pcVar2 = "Blue";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

constexpr decltype(auto) constexpr_switch(
    Lambda&& lambda,
    typename std::decay_t<decltype(*GlobValues)>::value_type searched,
    ResultGetterType&& def,
    BinaryPredicate&& pred = {}) {
  using result_t = std::invoke_result_t<ResultGetterType>;
  using hash_t = std::conditional_t<has_duplicate<GlobValues, Hash>(), Hash, typename Hash::secondary_hash>;
  static_assert(has_duplicate<GlobValues, hash_t>(), "magic_enum::detail::constexpr_switch duplicated hash found, please report it: https://github.com/Neargye/magic_enum/issues.");
  constexpr std::array values = *GlobValues;
  constexpr std::size_t size = values.size();
  constexpr std::array cases = calculate_cases<GlobValues, hash_t>(Page);

  switch (hash_v<hash_t>(searched)) {
    MAGIC_ENUM_FOR_EACH_256(MAGIC_ENUM_CASE)
    default:
      if constexpr (size > 256 + Page) {
        return constexpr_switch<GlobValues, CallValue, Page + 256, Hash>(std::forward<Lambda>(lambda), searched, std::forward<ResultGetterType>(def));
      }
      break;
  }
  return def();
}